

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction llvm::combineLostFractions(lostFraction moreSignificant,lostFraction lessSignificant)

{
  undefined4 local_c;
  lostFraction lessSignificant_local;
  lostFraction moreSignificant_local;
  
  local_c = moreSignificant;
  if (lessSignificant != lfExactlyZero) {
    if (moreSignificant == lfExactlyZero) {
      local_c = lfLessThanHalf;
    }
    else if (moreSignificant == lfExactlyHalf) {
      local_c = lfMoreThanHalf;
    }
  }
  return local_c;
}

Assistant:

static lostFraction
combineLostFractions(lostFraction moreSignificant,
                     lostFraction lessSignificant)
{
  if (lessSignificant != lfExactlyZero) {
    if (moreSignificant == lfExactlyZero)
      moreSignificant = lfLessThanHalf;
    else if (moreSignificant == lfExactlyHalf)
      moreSignificant = lfMoreThanHalf;
  }

  return moreSignificant;
}